

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS_util.cpp
# Opt level: O3

Vector<double,_std::allocator<double>_> *
amrex::VectorMin(Vector<double,_std::allocator<double>_> *__return_storage_ptr__,
                Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *mfs,
                IntVect *param_2,int sComp,int nComp,int nGrow)

{
  pointer ppMVar1;
  pointer ppMVar2;
  ulong uVar3;
  pointer pdVar4;
  long lVar5;
  Real RVar6;
  allocator_type local_45;
  int local_44;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *local_40;
  int local_34;
  
  local_44 = nGrow;
  local_40 = mfs;
  std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->super_vector<double,_std::allocator<double>_>,(long)nComp,
             &local_45);
  local_34 = nComp;
  if (0 < nComp) {
    uVar3 = 0;
    do {
      RVar6 = MultiFab::min(*(local_40->
                             super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                             ).
                             super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                             ._M_impl.super__Vector_impl_data._M_start,(int)uVar3 + sComp,local_44,
                            false);
      (__return_storage_ptr__->super_vector<double,_std::allocator<double>_>).
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [uVar3] = RVar6;
      uVar3 = uVar3 + 1;
    } while ((uint)nComp != uVar3);
  }
  ppMVar1 = (local_40->
            super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
            super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppMVar2 = (local_40->
            super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
            super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (8 < (long)ppMVar2 - (long)ppMVar1) {
    lVar5 = 1;
    do {
      if (0 < local_34) {
        pdVar4 = (__return_storage_ptr__->super_vector<double,_std::allocator<double>_>).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        uVar3 = 0;
        do {
          RVar6 = MultiFab::min((local_40->
                                super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                                ).
                                super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar5],sComp + (int)uVar3,
                                local_44,false);
          if (pdVar4[uVar3] <= RVar6) {
            RVar6 = pdVar4[uVar3];
          }
          pdVar4 = (__return_storage_ptr__->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar4[uVar3] = RVar6;
          uVar3 = uVar3 + 1;
        } while ((uint)nComp != uVar3);
        ppMVar1 = (local_40->
                  super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
                  super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppMVar2 = (local_40->
                  super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
                  super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (long)ppMVar2 - (long)ppMVar1 >> 3);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<Real>
  VectorMin(const Vector<const MultiFab *>& mfs,
            const IntVect&                  /*tilesize*/,
            int                             sComp,
            int                             nComp,
            int                             nGrow)
  {
    Vector<Real> gMin(nComp);

    for (int n=0; n<nComp; ++n) {
      gMin[n] = mfs[0]->min(sComp+n,nGrow);
    }

    for (int i=1; i<mfs.size(); ++i) {

      for (int n=0; n<nComp; ++n) {
        gMin[n] = std::min(gMin[n], mfs[i]->min(sComp+n,nGrow));
      }
    }

    return gMin;
  }